

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

ssize_t stream_recv(Curl_cfilter *cf,Curl_easy *data,stream_ctx *stream,char *buf,size_t len,
                   CURLcode *err)

{
  void *pvVar1;
  _Bool _Var2;
  byte bVar3;
  CURLcode CVar4;
  ssize_t sVar5;
  
  pvVar1 = cf->ctx;
  *err = CURLE_AGAIN;
  _Var2 = Curl_bufq_is_empty(&stream->recvbuf);
  if (_Var2) {
    if (stream->closed == true) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"[%d] returning CLOSE",(ulong)(uint)stream->id);
      }
      sVar5 = http2_handle_stream_close(cf,data,stream,err);
      if (-1 < sVar5) {
        return sVar5;
      }
      goto LAB_0069d535;
    }
    if (stream->reset == false) {
      bVar3 = *(byte *)((long)pvVar1 + 200);
      if ((bVar3 & 1) != 0) {
        _Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0x18));
        if (_Var2) goto LAB_0069d4d9;
        bVar3 = *(byte *)((long)pvVar1 + 200);
      }
      sVar5 = -1;
      if (((bVar3 & 2) == 0) || (stream->id <= *(int *)((long)pvVar1 + 0xc4))) goto LAB_0069d535;
    }
LAB_0069d4d9:
    if ((data != (Curl_easy *)0x0) &&
       ((((data->set).field_0x8bd & 0x10) != 0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"[%d] returning ERR",(ulong)(uint)stream->id);
    }
    CVar4 = CURLE_RECV_ERROR;
    if (stream->bodystarted != false) {
      CVar4 = CURLE_PARTIAL_FILE;
    }
  }
  else {
    sVar5 = Curl_bufq_read(&stream->recvbuf,(uchar *)buf,len,err);
    if (sVar5 < 0) goto LAB_0069d535;
    if (sVar5 != 0) {
      return sVar5;
    }
    CVar4 = CURLE_AGAIN;
  }
  *err = CVar4;
  sVar5 = -1;
LAB_0069d535:
  if (((data != (Curl_easy *)0x0 && *err != CURLE_AGAIN) && (((data->set).field_0x8bd & 0x10) != 0))
     && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"[%d] stream_recv(len=%zu) -> %zd, %d",(ulong)(uint)stream->id,len,
                      sVar5,*err);
  }
  return sVar5;
}

Assistant:

static ssize_t stream_recv(struct Curl_cfilter *cf, struct Curl_easy *data,
                           struct stream_ctx *stream,
                           char *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  ssize_t nread = -1;

  *err = CURLE_AGAIN;
  if(!Curl_bufq_is_empty(&stream->recvbuf)) {
    nread = Curl_bufq_read(&stream->recvbuf,
                           (unsigned char *)buf, len, err);
    if(nread < 0)
      goto out;
    DEBUGASSERT(nread > 0);
  }

  if(nread < 0) {
    if(stream->closed) {
      CURL_TRC_CF(data, cf, "[%d] returning CLOSE", stream->id);
      nread = http2_handle_stream_close(cf, data, stream, err);
    }
    else if(stream->reset ||
            (ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) ||
            (ctx->goaway && ctx->last_stream_id < stream->id)) {
      CURL_TRC_CF(data, cf, "[%d] returning ERR", stream->id);
      *err = stream->bodystarted? CURLE_PARTIAL_FILE : CURLE_RECV_ERROR;
      nread = -1;
    }
  }
  else if(nread == 0) {
    *err = CURLE_AGAIN;
    nread = -1;
  }

out:
  if(nread < 0 && *err != CURLE_AGAIN)
    CURL_TRC_CF(data, cf, "[%d] stream_recv(len=%zu) -> %zd, %d",
                stream->id, len, nread, *err);
  return nread;
}